

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

ostream * operator<<(ostream *os,total_game_stats_t *s)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,s->gameCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,s->winCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::ostream::_M_insert<double>(s->totalDuration);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, total_game_stats_t &s) {
  os << s.bestScore << "\n"
     << s.gameCount << "\n"
     << s.winCount << "\n"
     << s.totalMoveCount << "\n"
     << s.totalDuration;
  return os;
}